

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

RSAKey * BinarySource_get_rsa_ssh1_priv_agent(BinarySource *src)

{
  RSAKey *rsa;
  mp_int *pmVar1;
  
  rsa = (RSAKey *)safemalloc(1,0x48,0);
  rsa->bits = 0;
  rsa->bytes = 0;
  rsa->modulus = (mp_int *)0x0;
  rsa->exponent = (mp_int *)0x0;
  rsa->private_exponent = (mp_int *)0x0;
  rsa->p = (mp_int *)0x0;
  rsa->q = (mp_int *)0x0;
  rsa->iqmp = (mp_int *)0x0;
  rsa->comment = (char *)0x0;
  (rsa->sshk).vt = (ssh_keyalg *)0x0;
  BinarySource_get_rsa_ssh1_pub(src->binarysource_,rsa,RSA_SSH1_MODULUS_FIRST);
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_->binarysource_);
  rsa->private_exponent = pmVar1;
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_);
  rsa->iqmp = pmVar1;
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_);
  rsa->q = pmVar1;
  pmVar1 = BinarySource_get_mp_ssh1(src->binarysource_);
  rsa->p = pmVar1;
  return rsa;
}

Assistant:

RSAKey *BinarySource_get_rsa_ssh1_priv_agent(BinarySource *src)
{
    RSAKey *rsa = snew(RSAKey);
    memset(rsa, 0, sizeof(RSAKey));

    get_rsa_ssh1_pub(src, rsa, RSA_SSH1_MODULUS_FIRST);
    get_rsa_ssh1_priv(src, rsa);

    /* SSH-1 names p and q the other way round, i.e. we have the
     * inverse of p mod q and not of q mod p. We swap the names,
     * because our internal RSA wants iqmp. */
    rsa->iqmp = get_mp_ssh1(src);
    rsa->q = get_mp_ssh1(src);
    rsa->p = get_mp_ssh1(src);

    return rsa;
}